

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t handle_newmv(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *cur_mv,int *rate_mv,
                    HandleInterModeArgs *args,inter_mode_info *mode_info)

{
  int iVar1;
  int_mv iVar2;
  long lVar3;
  int iVar4;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  long in_R9;
  long in_stack_00000008;
  int_mv best_mv;
  int ref_mv_diff;
  int idx;
  MV prev_ref_mv [2];
  int best_match;
  int min_mv_diff;
  MV ref_mv_3;
  int search_range;
  int ref_idx;
  int_mv ref_mv_2;
  int_mv ref_mv_1;
  int_mv ref_mv;
  int i;
  int valid_mv1;
  int valid_mv0;
  int ref_mv_idx;
  int refs [2];
  PREDICTION_MODE this_mode;
  int is_comp_pred;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int in_stack_0000057c;
  int *in_stack_00000580;
  int in_stack_00000588;
  BLOCK_SIZE in_stack_0000058f;
  MACROBLOCK *in_stack_00000590;
  AV1_COMP *in_stack_00000598;
  inter_mode_info *in_stack_000005b0;
  int_mv *in_stack_000005b8;
  HandleInterModeArgs *in_stack_000005c0;
  int **in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  int_mv *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int local_b4;
  int local_a4;
  int local_98;
  int_mv local_94 [2];
  int local_8c;
  int local_88;
  int_mv local_84;
  int_mv local_80;
  int local_7c;
  undefined4 local_78;
  int_mv local_74;
  int_mv local_70;
  int_mv local_6c;
  int local_68;
  int local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  PREDICTION_MODE local_4d;
  int local_4c;
  MB_MODE_INFO *local_48;
  long local_40;
  long local_38;
  int *local_30;
  int *local_28;
  long local_10;
  
  local_40 = in_RSI + 0x1a0;
  local_48 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x2058);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  local_4c = has_second_ref(local_48);
  local_4d = local_48->mode;
  local_58 = (int)local_48->ref_frame[0];
  if (local_48->ref_frame[1] < '\0') {
    local_b4 = 0;
  }
  else {
    local_b4 = (int)local_48->ref_frame[1];
  }
  local_54 = local_b4;
  local_5c = (uint)((byte)(*(ushort *)&local_48->field_0xa7 >> 4) & 3);
  if (local_4c == 0) {
    local_78 = 0;
    local_7c = 0x7fffffff;
    if ((*(int *)(local_10 + 0x60a44) != 0) && ((*(ushort *)&local_48->field_0xa7 >> 4 & 3) != 0)) {
      local_84 = av1_get_ref_mv((MACROBLOCK *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                in_stack_ffffffffffffff34);
      local_88 = 0x7fffffff;
      local_8c = -1;
      local_80 = local_84;
      memset(local_94,0,8);
      for (local_98 = 0; local_98 < (int)(uint)((byte)(*(ushort *)&local_48->field_0xa7 >> 4) & 3);
          local_98 = local_98 + 1) {
        lVar3 = (long)local_98;
        iVar2 = av1_get_ref_mv_from_stack
                          (local_98,(MV_REFERENCE_FRAME *)
                                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           in_stack_ffffffffffffff34,
                           (MB_MODE_INFO_EXT *)&in_stack_ffffffffffffff28->as_mv);
        local_94[lVar3] = iVar2;
        iVar1 = (int)(short)local_80._0_2_ - (int)local_94[local_98].as_mv.row;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        iVar4 = (int)(short)local_80._2_2_ -
                (int)*(short *)((long)local_94 + (long)local_98 * 4 + 2);
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 < iVar1) {
          in_stack_ffffffffffffff3c = (int)(short)local_80._0_2_ - (int)local_94[local_98].as_mv.row
          ;
          if (in_stack_ffffffffffffff3c < 1) {
            in_stack_ffffffffffffff3c = -in_stack_ffffffffffffff3c;
          }
        }
        else {
          in_stack_ffffffffffffff3c =
               (int)(short)local_80._2_2_ - (int)*(short *)((long)local_94 + (long)local_98 * 4 + 2)
          ;
          if (in_stack_ffffffffffffff3c < 1) {
            in_stack_ffffffffffffff3c = -in_stack_ffffffffffffff3c;
          }
        }
        if (in_stack_ffffffffffffff3c < local_88) {
          local_88 = in_stack_ffffffffffffff3c;
          local_8c = local_98;
        }
      }
      if ((local_88 < 0x80) &&
         (*(int *)(*(long *)(local_38 + 0x60) + (long)local_8c * 0x20 + (long)local_58 * 4) != 0)) {
        local_7c = local_88;
        iVar1 = (int)*(short *)(*(long *)(local_38 + 0x50) + (long)local_8c * 0x20 +
                               (long)local_58 * 4) - (int)local_94[local_8c].as_mv.row;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        iVar4 = (int)*(short *)(*(long *)(local_38 + 0x50) + (long)local_8c * 0x20 + 2 +
                               (long)local_58 * 4) -
                (int)*(short *)((long)local_94 + (long)local_8c * 4 + 2);
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 < iVar1) {
          iVar1 = (int)*(short *)(*(long *)(local_38 + 0x50) + (long)local_8c * 0x20 +
                                 (long)local_58 * 4) - (int)local_94[local_8c].as_mv.row;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
        }
        else {
          iVar1 = (int)*(short *)(*(long *)(local_38 + 0x50) + (long)local_8c * 0x20 + 2 +
                                 (long)local_58 * 4) -
                  (int)*(short *)((long)local_94 + (long)local_8c * 4 + 2);
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
        }
        local_7c = iVar1 + local_88 + 4 >> 3;
      }
    }
    av1_single_motion_search
              (in_stack_00000598,in_stack_00000590,in_stack_0000058f,in_stack_00000588,
               in_stack_00000580,in_stack_0000057c,in_stack_000005b0,in_stack_000005b8,
               in_stack_000005c0);
    if (local_a4 == -0x7fff8000) {
      return 0x7fffffffffffffff;
    }
    *(int *)(*(long *)(local_38 + 0x50) + (long)(int)local_5c * 0x20 + (long)local_58 * 4) =
         local_a4;
    *(int *)(*(long *)(local_38 + 0x58) + (long)(int)local_5c * 0x20 + (long)local_58 * 4) =
         *local_30;
    *(undefined4 *)(*(long *)(local_38 + 0x60) + (long)(int)local_5c * 0x20 + (long)local_58 * 4) =
         1;
    *local_28 = local_a4;
    if (*(int *)(in_stack_00000008 +
                 (ulong)((byte)(*(ushort *)&local_48->field_0xa7 >> 4) & 3) * 0x14 + 0x10) != 0) {
      return 0x7fffffffffffffff;
    }
  }
  else {
    local_60 = *(int *)(*(long *)(local_38 + 0x60) + (long)(int)local_5c * 0x20 + (long)local_58 * 4
                       );
    local_64 = *(int *)(*(long *)(local_38 + 0x60) + (long)(int)local_5c * 0x20 + (long)local_b4 * 4
                       );
    iVar1 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    if (local_4d == '\x18') {
      if (local_60 != 0) {
        *local_28 = *(int *)(*(long *)(local_38 + 0x50) + (long)(int)local_5c * 0x20 +
                            (long)local_58 * 4);
        clamp_mv_in_range((MACROBLOCK *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28,iVar1);
      }
      if (local_64 != 0) {
        local_28[1] = *(int *)(*(long *)(local_38 + 0x50) + (long)(int)local_5c * 0x20 +
                              (long)local_54 * 4);
        clamp_mv_in_range((MACROBLOCK *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20))
        ;
      }
      *local_30 = 0;
      for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
        local_6c = av1_get_ref_mv((MACROBLOCK *)
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  in_stack_ffffffffffffff34);
        iVar1 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                &in_stack_ffffffffffffff28->as_mv,in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff18,0);
        *local_30 = iVar1 + *local_30;
      }
    }
    else if ((local_4d == '\x13') || (local_4d == '\x15')) {
      if (local_64 != 0) {
        local_28[1] = *(int *)(*(long *)(local_38 + 0x50) + (long)(int)local_5c * 0x20 +
                              (long)local_b4 * 4);
        clamp_mv_in_range((MACROBLOCK *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28,iVar1);
      }
      local_70 = av1_get_ref_mv((MACROBLOCK *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                in_stack_ffffffffffffff34);
      iVar1 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              &in_stack_ffffffffffffff28->as_mv,in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff18,0);
      *local_30 = iVar1;
    }
    else {
      if (local_60 != 0) {
        *local_28 = *(int *)(*(long *)(local_38 + 0x50) + (long)(int)local_5c * 0x20 +
                            (long)local_58 * 4);
        clamp_mv_in_range((MACROBLOCK *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28,iVar1);
      }
      local_74 = av1_get_ref_mv((MACROBLOCK *)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                in_stack_ffffffffffffff34);
      iVar1 = av1_mv_bit_cost((MV *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              &in_stack_ffffffffffffff28->as_mv,in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff18,0);
      *local_30 = iVar1;
    }
  }
  return 0;
}

Assistant:

static int64_t handle_newmv(const AV1_COMP *const cpi, MACROBLOCK *const x,
                            const BLOCK_SIZE bsize, int_mv *cur_mv,
                            int *const rate_mv, HandleInterModeArgs *const args,
                            inter_mode_info *mode_info) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);
  const PREDICTION_MODE this_mode = mbmi->mode;
  const int refs[2] = { mbmi->ref_frame[0],
                        mbmi->ref_frame[1] < 0 ? 0 : mbmi->ref_frame[1] };
  const int ref_mv_idx = mbmi->ref_mv_idx;

  if (is_comp_pred) {
    const int valid_mv0 = args->single_newmv_valid[ref_mv_idx][refs[0]];
    const int valid_mv1 = args->single_newmv_valid[ref_mv_idx][refs[1]];
    if (this_mode == NEW_NEWMV) {
      if (valid_mv0) {
        cur_mv[0].as_int = args->single_newmv[ref_mv_idx][refs[0]].as_int;
        clamp_mv_in_range(x, &cur_mv[0], 0);
      }
      if (valid_mv1) {
        cur_mv[1].as_int = args->single_newmv[ref_mv_idx][refs[1]].as_int;
        clamp_mv_in_range(x, &cur_mv[1], 1);
      }
      *rate_mv = 0;
      for (int i = 0; i < 2; ++i) {
        const int_mv ref_mv = av1_get_ref_mv(x, i);
        *rate_mv += av1_mv_bit_cost(&cur_mv[i].as_mv, &ref_mv.as_mv,
                                    x->mv_costs->nmv_joint_cost,
                                    x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
      }
    } else if (this_mode == NEAREST_NEWMV || this_mode == NEAR_NEWMV) {
      if (valid_mv1) {
        cur_mv[1].as_int = args->single_newmv[ref_mv_idx][refs[1]].as_int;
        clamp_mv_in_range(x, &cur_mv[1], 1);
      }
      const int_mv ref_mv = av1_get_ref_mv(x, 1);
      *rate_mv = av1_mv_bit_cost(&cur_mv[1].as_mv, &ref_mv.as_mv,
                                 x->mv_costs->nmv_joint_cost,
                                 x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
    } else {
      assert(this_mode == NEW_NEARESTMV || this_mode == NEW_NEARMV);
      if (valid_mv0) {
        cur_mv[0].as_int = args->single_newmv[ref_mv_idx][refs[0]].as_int;
        clamp_mv_in_range(x, &cur_mv[0], 0);
      }
      const int_mv ref_mv = av1_get_ref_mv(x, 0);
      *rate_mv = av1_mv_bit_cost(&cur_mv[0].as_mv, &ref_mv.as_mv,
                                 x->mv_costs->nmv_joint_cost,
                                 x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
    }
  } else {
    // Single ref case.
    const int ref_idx = 0;
    int search_range = INT_MAX;

    if (cpi->sf.mv_sf.reduce_search_range && mbmi->ref_mv_idx > 0) {
      const MV ref_mv = av1_get_ref_mv(x, ref_idx).as_mv;
      int min_mv_diff = INT_MAX;
      int best_match = -1;
      MV prev_ref_mv[2] = { { 0 } };
      for (int idx = 0; idx < mbmi->ref_mv_idx; ++idx) {
        prev_ref_mv[idx] = av1_get_ref_mv_from_stack(ref_idx, mbmi->ref_frame,
                                                     idx, &x->mbmi_ext)
                               .as_mv;
        const int ref_mv_diff = AOMMAX(abs(ref_mv.row - prev_ref_mv[idx].row),
                                       abs(ref_mv.col - prev_ref_mv[idx].col));

        if (min_mv_diff > ref_mv_diff) {
          min_mv_diff = ref_mv_diff;
          best_match = idx;
        }
      }

      if (min_mv_diff < (16 << 3)) {
        if (args->single_newmv_valid[best_match][refs[0]]) {
          search_range = min_mv_diff;
          search_range +=
              AOMMAX(abs(args->single_newmv[best_match][refs[0]].as_mv.row -
                         prev_ref_mv[best_match].row),
                     abs(args->single_newmv[best_match][refs[0]].as_mv.col -
                         prev_ref_mv[best_match].col));
          // Get full pixel search range.
          search_range = (search_range + 4) >> 3;
        }
      }
    }

    int_mv best_mv;
    av1_single_motion_search(cpi, x, bsize, ref_idx, rate_mv, search_range,
                             mode_info, &best_mv, args);
    if (best_mv.as_int == INVALID_MV) return INT64_MAX;

    args->single_newmv[ref_mv_idx][refs[0]] = best_mv;
    args->single_newmv_rate[ref_mv_idx][refs[0]] = *rate_mv;
    args->single_newmv_valid[ref_mv_idx][refs[0]] = 1;
    cur_mv[0].as_int = best_mv.as_int;

    // Return after single_newmv is set.
    if (mode_info[mbmi->ref_mv_idx].skip) return INT64_MAX;
  }

  return 0;
}